

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O3

unsigned_fast_type
math::wide_integer::lsb<128u,unsigned_short,void,false>
          (uintwide_t<128U,_unsigned_short,_void,_false> *x)

{
  ushort uVar1;
  ulong uVar2;
  unsigned_fast_type uVar3;
  ulong uVar4;
  
  uVar3 = 0;
  do {
    uVar1 = *(ushort *)x;
    if (uVar1 != 0) {
      uVar4 = (ulong)uVar1;
      if ((uVar1 & 1) == 0) {
        do {
          uVar3 = uVar3 + 1;
          uVar2 = uVar4 & 2;
          uVar4 = uVar4 >> 1;
        } while (uVar2 == 0);
      }
      return uVar3;
    }
    uVar3 = uVar3 + 0x10;
    x = (uintwide_t<128U,_unsigned_short,_void,_false> *)((long)x + 2);
  } while (uVar3 != 0x80);
  return 0;
}

Assistant:

constexpr auto lsb(const uintwide_t<Width2, LimbType, AllocatorType, IsSigned>& x) -> unsigned_fast_type
  {
    // Calculate the position of the least-significant bit.
    // Use a linear search starting from the least significant limb.

    using local_wide_integer_type = uintwide_t<Width2, LimbType, AllocatorType, IsSigned>;
    using local_value_type        = typename local_wide_integer_type::representation_type::value_type;

    auto bpos   = static_cast<unsigned_fast_type>(UINT8_C(0));
    auto offset = static_cast<unsigned_fast_type>(UINT8_C(0));

    for(auto it = x.crepresentation().cbegin(); it != x.crepresentation().cend(); ++it, ++offset) // NOLINT(llvm-qualified-auto,readability-qualified-auto,altera-id-dependent-backward-branch)
    {
      const auto vi = static_cast<local_value_type>(*it & (std::numeric_limits<local_value_type>::max)());

      if(vi != static_cast<local_value_type>(UINT8_C(0)))
      {
        bpos =
          static_cast<unsigned_fast_type>
          (
              detail::lsb_helper(*it)
            + static_cast<unsigned_fast_type>
              (
                static_cast<unsigned_fast_type>(std::numeric_limits<local_value_type>::digits) * offset
              )
          );

        break;
      }
    }

    return bpos;
  }